

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O0

void apply_sharpen(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float sharpness_val)

{
  bool bVar1;
  MatCommaInitializer_<double> *pMVar2;
  MatCommaInitializer_ *pMVar3;
  ostream *poVar4;
  Point_<int> local_2c8;
  _InputArray local_2c0;
  _OutputArray local_2a8;
  _InputArray local_290;
  Mat *local_278;
  Mat *img;
  iterator __end1;
  iterator __begin1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range1;
  MatCommaInitializer_<double> local_1f8;
  Mat_<double> local_1d0;
  Mat_<double> local_160;
  MatCommaInitializer_<double> local_100;
  Mat_<double> local_d8;
  Mat local_78 [8];
  Mat sharpeningKernel;
  float sharpness_val_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list_local;
  
  cv::Mat_<double>::Mat_(&local_160,3,3);
  cv::operator<<(&local_100,&local_160,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(&local_100,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,sharpness_val);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar3 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_d8,pMVar3);
  cv::Mat::Mat(local_78,&local_d8.super_Mat);
  cv::Mat_<double>::~Mat_(&local_d8);
  cv::Mat_<double>::~Mat_(&local_160);
  if ((sharpness_val != 1.0) || (NAN(sharpness_val))) {
    cv::Mat_<double>::Mat_((Mat_<double> *)&__range1,3,3);
    cv::operator<<(&local_1f8,(Mat_<double> *)&__range1,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(&local_1f8,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,sharpness_val);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar3 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_1d0,pMVar3);
    cv::Mat::operator=(local_78,&local_1d0.super_Mat);
    cv::Mat_<double>::~Mat_(&local_1d0);
    cv::Mat_<double>::~Mat_((Mat_<double> *)&__range1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"Changing Sharpness : ");
  std::operator<<(poVar4,(string *)color::reset_abi_cxx11_);
  __end1 = CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(image_list);
  img = (Mat *)CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end(image_list);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                                     *)&img), bVar1) {
    local_278 = __gnu_cxx::
                __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
                operator*(&__end1);
    cv::_InputArray::_InputArray(&local_290,local_278);
    cv::_OutputArray::_OutputArray(&local_2a8,local_278);
    cv::_InputArray::_InputArray(&local_2c0,local_78);
    cv::Point_<int>::Point_(&local_2c8,-1,-1);
    cv::filter2D(0,&local_290,&local_2a8,0xffffffff,&local_2c0,&local_2c8,4);
    cv::_InputArray::~_InputArray(&local_2c0);
    cv::_OutputArray::~_OutputArray(&local_2a8);
    cv::_InputArray::~_InputArray(&local_290);
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&__end1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)color::green_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"Done");
  poVar4 = std::operator<<(poVar4,(string *)color::reset_abi_cxx11_);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  cv::Mat::~Mat(local_78);
  return;
}

Assistant:

void apply_sharpen(std::vector<cv::Mat> &image_list, float sharpness_val) {
   Mat sharpeningKernel = (Mat_<double>(3,3) << 0, 0, 0, 0, sharpness_val, 0, 0, 0, 0);
   if(sharpness_val != 1)
   {
      sharpeningKernel = (Mat_<double>(3,3) << -1, -1, -1, -1, sharpness_val, -1, -1, -1, -1);
   }
   std::cout << color::blue << "Changing Sharpness : " << color::reset;
   for(auto &img: image_list) {
      filter2D(img, img, -1, sharpeningKernel);
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}